

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall icu_63::DecimalFormat::setParseIntegerOnly(DecimalFormat *this,UBool value)

{
  UErrorCode localStatus;
  LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> LStack_18;
  
  LStack_18.ptr =
       (this->fields->properties).
       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if ((LStack_18.ptr)->parseIntegerOnly != (bool)value) {
    NumberFormat::setParseIntegerOnly(&this->super_NumberFormat,value);
    ((this->fields->properties).
     super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->parseIntegerOnly =
         value != '\0';
    LStack_18.ptr = LStack_18.ptr & 0xffffffff;
    touch(this,(UErrorCode *)((long)&LStack_18.ptr + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setParseIntegerOnly(UBool value) {
    if (UBOOL_TO_BOOL(value) == fields->properties->parseIntegerOnly) { return; }
    NumberFormat::setParseIntegerOnly(value); // to set field for compatibility
    fields->properties->parseIntegerOnly = value;
    touchNoError();
}